

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O1

bool __thiscall Json::Value::CZString::operator==(CZString *this,CZString *other)

{
  int iVar1;
  uint uVar2;
  
  if (this->cstr_ == (char *)0x0) {
    return (this->field_1).index_ == (other->field_1).index_;
  }
  uVar2 = (this->field_1).index_ >> 2;
  if (uVar2 == (other->field_1).index_ >> 2) {
    iVar1 = bcmp(this->cstr_,other->cstr_,(ulong)uVar2);
    return iVar1 == 0;
  }
  return false;
}

Assistant:

bool Value::CZString::operator==(const CZString& other) const {
  if (!cstr_) return index_ == other.index_;
  //return strcmp(cstr_, other.cstr_) == 0;
  // Assume both are strings.
  unsigned this_len = this->storage_.length_;
  unsigned other_len = other.storage_.length_;
  if (this_len != other_len) return false;
  int comp = memcmp(this->cstr_, other.cstr_, this_len);
  return comp == 0;
}